

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  bool bVar1;
  DeathTestOutcome DVar2;
  string *output;
  Message *this_00;
  ostream *poVar3;
  byte in_SIL;
  DeathTestImpl *in_RDI;
  ostringstream stream;
  Message buffer;
  bool success;
  string error_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffc60;
  Message *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  int exit_code;
  string *in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  GTestLogSeverity severity;
  GTestLog *in_stack_fffffffffffffce0;
  string local_2e0 [36];
  GTestLog local_2bc;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  ostringstream local_238 [376];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  char *local_60;
  byte local_39;
  string local_38 [39];
  byte local_11;
  byte local_1;
  
  exit_code = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  severity = (GTestLogSeverity)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  local_11 = in_SIL & 1;
  bVar1 = spawned(in_RDI);
  if (bVar1) {
    (*(in_RDI->super_DeathTest)._vptr_DeathTest[6])(local_38);
    local_39 = 0;
    Message::Message((Message *)in_stack_fffffffffffffc90);
    Message::operator<<((Message *)in_stack_fffffffffffffc60,
                        (char (*) [13])in_stack_fffffffffffffc58);
    local_60 = statement(in_RDI);
    Message::operator<<((Message *)in_stack_fffffffffffffc60,(char **)in_stack_fffffffffffffc58);
    Message::operator<<((Message *)in_stack_fffffffffffffc60,(char (*) [2])in_stack_fffffffffffffc58
                       );
    DVar2 = outcome(in_RDI);
    switch(DVar2) {
    case IN_PROGRESS:
    default:
      GTestLog::GTestLog(in_stack_fffffffffffffce0,severity,in_stack_fffffffffffffcd0,
                         (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      poVar3 = GTestLog::GetStream(&local_2bc);
      std::operator<<(poVar3,"DeathTest::Passed somehow called before conclusion of test");
      GTestLog::~GTestLog((GTestLog *)in_stack_fffffffffffffc60);
      break;
    case DIED:
      if ((local_11 & 1) == 0) {
        Message::operator<<((Message *)in_stack_fffffffffffffc60,
                            (char (*) [51])in_stack_fffffffffffffc58);
        Message::operator<<((Message *)in_stack_fffffffffffffc60,
                            (char (*) [13])in_stack_fffffffffffffc58);
        status(in_RDI);
        ExitSummary_abi_cxx11_(exit_code);
        Message::operator<<((Message *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        in_stack_fffffffffffffc68 =
             Message::operator<<((Message *)in_stack_fffffffffffffc60,
                                 (char (*) [2])in_stack_fffffffffffffc58);
        this_00 = Message::operator<<((Message *)in_stack_fffffffffffffc60,
                                      (char (*) [13])in_stack_fffffffffffffc58);
        FormatDeathTestOutput(in_stack_fffffffffffffcc8);
        Message::operator<<(this_00,in_stack_fffffffffffffc58);
        std::__cxx11::string::~string(local_2b8);
        std::__cxx11::string::~string(local_298);
      }
      else {
        bVar1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ::Matches(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        if (bVar1) {
          local_39 = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_238);
          MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::DescribeTo(in_stack_fffffffffffffc60,(ostream *)in_stack_fffffffffffffc58);
          Message::operator<<((Message *)in_stack_fffffffffffffc60,
                              (char (*) [47])in_stack_fffffffffffffc58);
          Message::operator<<((Message *)in_stack_fffffffffffffc60,
                              (char (*) [13])in_stack_fffffffffffffc58);
          std::__cxx11::ostringstream::str();
          Message::operator<<((Message *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          Message::operator<<((Message *)in_stack_fffffffffffffc60,
                              (char (*) [2])in_stack_fffffffffffffc58);
          Message::operator<<((Message *)in_stack_fffffffffffffc60,
                              (char (*) [13])in_stack_fffffffffffffc58);
          FormatDeathTestOutput(in_stack_fffffffffffffcc8);
          Message::operator<<((Message *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
          std::__cxx11::string::~string(local_278);
          std::__cxx11::string::~string(local_258);
          std::__cxx11::ostringstream::~ostringstream(local_238);
        }
      }
      break;
    case LIVED:
      Message::operator<<((Message *)in_stack_fffffffffffffc60,
                          (char (*) [28])in_stack_fffffffffffffc58);
      Message::operator<<((Message *)in_stack_fffffffffffffc60,
                          (char (*) [13])in_stack_fffffffffffffc58);
      FormatDeathTestOutput(in_stack_fffffffffffffcc8);
      Message::operator<<((Message *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      std::__cxx11::string::~string(local_80);
      break;
    case RETURNED:
      output = (string *)
               Message::operator<<((Message *)in_stack_fffffffffffffc60,
                                   (char (*) [47])in_stack_fffffffffffffc58);
      Message::operator<<((Message *)in_stack_fffffffffffffc60,
                          (char (*) [13])in_stack_fffffffffffffc58);
      FormatDeathTestOutput(output);
      Message::operator<<((Message *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      std::__cxx11::string::~string(local_c0);
      break;
    case THREW:
      Message::operator<<((Message *)in_stack_fffffffffffffc60,
                          (char (*) [33])in_stack_fffffffffffffc58);
      Message::operator<<((Message *)in_stack_fffffffffffffc60,
                          (char (*) [13])in_stack_fffffffffffffc58);
      FormatDeathTestOutput(in_stack_fffffffffffffcc8);
      Message::operator<<((Message *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      std::__cxx11::string::~string(local_a0);
    }
    Message::GetString_abi_cxx11_(in_stack_fffffffffffffc68);
    DeathTest::set_last_death_test_message((string *)0x13442b);
    std::__cxx11::string::~string(local_2e0);
    local_1 = local_39 & 1;
    Message::~Message((Message *)0x134457);
    std::__cxx11::string::~string(local_38);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}